

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voprf.cc
# Opt level: O3

int dleq_generate(VOPRF_METHOD *method,CBB *cbb,TRUST_TOKEN_ISSUER_KEY *priv,EC_JACOBIAN *T,
                 EC_JACOBIAN *W)

{
  int iVar1;
  EC_GROUP *group;
  EC_SCALAR r;
  EC_SCALAR u;
  EC_SCALAR c;
  EC_SCALAR c_mont;
  EC_AFFINE affines [4];
  EC_JACOBIAN jacobians [4];
  EC_AFFINE *in_stack_fffffffffffff908;
  EC_SCALAR local_6b0;
  EC_SCALAR local_668;
  EC_SCALAR local_620;
  EC_AFFINE local_5d8;
  EC_AFFINE local_548;
  EC_AFFINE local_4b8;
  EC_AFFINE local_428;
  EC_JACOBIAN local_398;
  undefined1 local_2c0 [216];
  EC_JACOBIAN local_1e8;
  EC_JACOBIAN local_110;
  
  group = (*voprf_exp2_method.group_func)();
  iVar1 = ec_random_nonzero_scalar(group,(EC_SCALAR *)&stack0xfffffffffffff908,"");
  if (((iVar1 != 0) &&
      (iVar1 = ec_point_mul_scalar_base(group,&local_1e8,(EC_SCALAR *)&stack0xfffffffffffff908),
      iVar1 != 0)) &&
     (iVar1 = ec_point_mul_scalar(group,&local_110,(EC_JACOBIAN *)priv,
                                  (EC_SCALAR *)&stack0xfffffffffffff908), iVar1 != 0)) {
    memcpy(&local_398,priv,0xd8);
    memcpy(local_2c0,T,0xd8);
    iVar1 = ec_jacobian_to_affine_batch(group,&local_5d8,&local_398,4);
    if ((iVar1 != 0) &&
       (iVar1 = hash_to_scalar_dleq((VOPRF_METHOD *)&local_668,(EC_SCALAR *)(cbb + 0xc9),&local_5d8,
                                    &local_548,&local_4b8,&local_428,in_stack_fffffffffffff908),
       iVar1 != 0)) {
      ec_scalar_to_montgomery(group,&local_620,&local_668);
      ec_scalar_mul_montgomery(group,&local_6b0,(EC_SCALAR *)(cbb + 6),&local_620);
      ec_scalar_add(group,&local_6b0,(EC_SCALAR *)&stack0xfffffffffffff908,&local_6b0);
      iVar1 = scalar_to_cbb((CBB *)method,group,&local_668);
      if (iVar1 != 0) {
        iVar1 = scalar_to_cbb((CBB *)method,group,&local_6b0);
        return iVar1;
      }
    }
  }
  return 0;
}

Assistant:

static int dleq_generate(const VOPRF_METHOD *method, CBB *cbb,
                         const TRUST_TOKEN_ISSUER_KEY *priv,
                         const EC_JACOBIAN *T, const EC_JACOBIAN *W) {
  const EC_GROUP *group = method->group_func();

  enum {
    idx_T,
    idx_W,
    idx_k0,
    idx_k1,
    num_idx,
  };
  EC_JACOBIAN jacobians[num_idx];

  // Setup the DLEQ proof.
  EC_SCALAR r;
  if (  // r <- Zp
      !ec_random_nonzero_scalar(group, &r, kDefaultAdditionalData) ||
      // k0;k1 = r*(G;T)
      !ec_point_mul_scalar_base(group, &jacobians[idx_k0], &r) ||
      !ec_point_mul_scalar(group, &jacobians[idx_k1], T, &r)) {
    return 0;
  }

  EC_AFFINE affines[num_idx];
  jacobians[idx_T] = *T;
  jacobians[idx_W] = *W;
  if (!ec_jacobian_to_affine_batch(group, affines, jacobians, num_idx)) {
    return 0;
  }

  // Compute c = Hc(...).
  EC_SCALAR c;
  if (!hash_to_scalar_dleq(method, &c, &priv->pubs, &affines[idx_T],
                           &affines[idx_W], &affines[idx_k0],
                           &affines[idx_k1])) {
    return 0;
  }


  EC_SCALAR c_mont;
  ec_scalar_to_montgomery(group, &c_mont, &c);

  // u = r + c*xs
  EC_SCALAR u;
  ec_scalar_mul_montgomery(group, &u, &priv->xs, &c_mont);
  ec_scalar_add(group, &u, &r, &u);

  // Store DLEQ proof in transcript.
  if (!scalar_to_cbb(cbb, group, &c) || !scalar_to_cbb(cbb, group, &u)) {
    return 0;
  }

  return 1;
}